

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector4f.cpp
# Opt level: O2

void __thiscall Vector4f::Vector4f(Vector4f *this,Vector2f *xy,float z,float w)

{
  float fVar1;
  
  fVar1 = Vector2f::x(xy);
  this->m_elements[0] = fVar1;
  fVar1 = Vector2f::y(xy);
  this->m_elements[1] = fVar1;
  this->m_elements[2] = z;
  this->m_elements[3] = w;
  return;
}

Assistant:

Vector4f::Vector4f( const Vector2f& xy, float z, float w )
{
	m_elements[0] = xy.x();
	m_elements[1] = xy.y();
	m_elements[2] = z;
	m_elements[3] = w;
}